

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O3

ptr<Value> __thiscall
PrimitiveExpression<String>::evaluate(PrimitiveExpression<String> *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  undefined1 local_29;
  Expression local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_Expression = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<String,std::allocator<String>,String&>
            (a_Stack_20,(String **)&local_28,(allocator<String> *)&local_29,
             (String *)&(env->symbols)._M_h._M_bucket_count);
  (this->super_Expression)._vptr_Expression = local_28._vptr_Expression;
  (this->value).super_Value.super_Member._vptr_Member = (_func_int **)a_Stack_20[0]._M_pi;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }